

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_constraint_messages_tests.c
# Opt level: O0

Constraint * create_piece_fit_in_box_constraint(intptr_t expected_value,char *expected_value_name)

{
  Constraint *pCVar1;
  char *pcVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  Constraint *constraint;
  undefined8 local_30;
  anon_union_8_4_d526cc82_for_value local_28;
  size_t local_20;
  Constraint *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  pCVar1 = (Constraint *)create_constraint();
  local_18 = pCVar1;
  make_cgreen_pointer_value(&local_30,local_8);
  *(undefined8 *)&pCVar1->expected_value = local_30;
  (pCVar1->expected_value).value = local_28;
  (pCVar1->expected_value).value_size = local_20;
  pcVar2 = (char *)string_dup(local_10);
  local_18->expected_value_name = pcVar2;
  local_18->type = CGREEN_CONTENT_COMPARER_CONSTRAINT;
  local_18->compare = compare_piece_and_box_size;
  local_18->execute = test_fit_piece;
  local_18->name = "fit in box";
  local_18->size_of_expected_value = 8;
  return local_18;
}

Assistant:

Constraint *create_piece_fit_in_box_constraint(intptr_t expected_value, const char *expected_value_name) {
    Constraint *constraint = create_constraint();

    constraint->expected_value = make_cgreen_pointer_value((void*)expected_value);
    constraint->expected_value_name = string_dup(expected_value_name);
    constraint->type = CGREEN_CONTENT_COMPARER_CONSTRAINT;

    constraint->compare = &compare_piece_and_box_size;
    constraint->execute = &test_fit_piece;
    constraint->name = "fit in box";
    constraint->size_of_expected_value = sizeof(intptr_t);

    return constraint;
}